

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockParameterTest_outputParameterWithIgnoredParameters_TestShell::createTest
          (TEST_MockParameterTest_outputParameterWithIgnoredParameters_TestShell *this)

{
  Utest *this_00;
  TEST_MockParameterTest_outputParameterWithIgnoredParameters_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
                                  ,0x351);
  TEST_MockParameterTest_outputParameterWithIgnoredParameters_Test::
  TEST_MockParameterTest_outputParameterWithIgnoredParameters_Test
            ((TEST_MockParameterTest_outputParameterWithIgnoredParameters_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockParameterTest, outputParameterWithIgnoredParameters)
{
    int param = 1;
    int retval = 2;

    mock().expectOneCall("foo").withOutputParameterReturning("bar", &param, sizeof(param)).ignoreOtherParameters();
    mock().actualCall("foo").withOutputParameter("bar", &retval).withParameter("other", 1);

    LONGS_EQUAL(param, retval);

    mock().checkExpectations();
}